

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O3

void copy_tensor(TENSOR *src,int copy_channels,int dst_offset,TENSOR *dst)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  
  if ((src->stride == dst->width) && (dst->stride == src->stride)) {
    if (0 < copy_channels) {
      uVar2 = 0;
      do {
        memcpy(dst->buf[(long)dst_offset + uVar2],src->buf[uVar2],
               (long)src->height * (long)src->width * 4);
        uVar2 = uVar2 + 1;
      } while ((uint)copy_channels != uVar2);
    }
  }
  else if (0 < copy_channels) {
    iVar1 = dst->height;
    uVar2 = 0;
    do {
      if (0 < iVar1) {
        iVar3 = 0;
        do {
          memcpy(dst->buf[(long)dst_offset + uVar2] + (long)dst->stride * (long)iVar3,
                 src->buf[uVar2] + (long)src->stride * (long)iVar3,(long)dst->width << 2);
          iVar3 = iVar3 + 1;
          iVar1 = dst->height;
        } while (iVar3 < iVar1);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)copy_channels);
  }
  return;
}

Assistant:

static void copy_tensor(const TENSOR *src, int copy_channels, int dst_offset,
                        TENSOR *dst) {
  assert(src->width == dst->width);
  assert(src->height == dst->height);
  assert(copy_channels <= src->channels);
  if (src->stride == dst->width && dst->stride == dst->width) {
    for (int c = 0; c < copy_channels; ++c) {
      memcpy(dst->buf[dst_offset + c], src->buf[c],
             sizeof(*dst->buf[0]) * src->width * src->height);
    }
  } else {
    for (int c = 0; c < copy_channels; ++c) {
      for (int r = 0; r < dst->height; ++r) {
        memcpy(&dst->buf[dst_offset + c][r * dst->stride],
               &src->buf[c][r * src->stride],
               dst->width * sizeof(*dst->buf[c]));
      }
    }
  }
}